

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::InstanceSymbol::fromSyntax
               (Compilation *comp,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,BindDirectiveInfo *bindInfo
               ,SyntaxNode *overrideSyntax)

{
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  SourceRange sourceRange;
  string_view name;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  string_view name_00;
  SourceRange sourceRange_00;
  string_view name_01;
  bool bVar1;
  GenerateBlockSymbol *pGVar2;
  iterator ppVar3;
  Scope *this;
  undefined8 in_RCX;
  Compilation *in_RDX;
  undefined8 in_RSI;
  HierarchyInstantiationSyntax *in_RDI;
  undefined8 in_R8;
  long in_R9;
  SourceRange SVar4;
  ASTContext *unaff_retaddr;
  SourceLocation in_stack_00000008;
  DiagCode in_stack_00000014;
  undefined1 in_stack_00000018 [16];
  DefinitionLookupResult defResult;
  type *instSyntax;
  type *defResult_2;
  iterator __end4;
  iterator __begin4;
  ResolvedInstanceRules *__range4;
  ResolvedInstanceRules instanceRules;
  ResolvedConfig *rc;
  DefinitionLookupResult defResult_1;
  anon_class_72_9_2532bcb6 createInstances;
  InstanceBuilder builder;
  ResolvedConfig *resolvedConfig;
  HierarchyOverrideNode *parentOverrideNode;
  DefinitionSymbol *owningDefinition;
  Symbol *sym_1;
  CheckerInstanceBodySymbol *body;
  Symbol *sym;
  Scope *currScope;
  InstanceBodySymbol *parentInst;
  bool inChecker;
  bitmask<slang::ast::InstanceFlags> flags;
  TimeTraceScope timeScope;
  string_view defName;
  bitmask<slang::ast::InstanceFlags> *in_stack_fffffffffffffae8;
  SourceLocation SVar5;
  bitmask<slang::ast::InstanceFlags> *in_stack_fffffffffffffaf0;
  SourceLocation SVar6;
  ConfigBlockSymbol *in_stack_fffffffffffffaf8;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffb00;
  ASTContext *in_stack_fffffffffffffb08;
  SourceLocation in_stack_fffffffffffffb10;
  SourceLocation in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  DiagCode in_stack_fffffffffffffb24;
  HierarchyOverrideNode *in_stack_fffffffffffffb30;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffb38;
  Scope *in_stack_fffffffffffffb40;
  Compilation *this_00;
  undefined8 uVar7;
  DiagCode code;
  SourceLocation SVar8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb60;
  SourceLocation in_stack_fffffffffffffb70;
  SourceLocation in_stack_fffffffffffffb78;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffb80;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffb88;
  ASTContext *in_stack_fffffffffffffb90;
  HierarchyInstantiationSyntax *in_stack_fffffffffffffb98;
  Compilation *in_stack_fffffffffffffba0;
  Scope *in_stack_fffffffffffffbb8;
  BindDirectiveInfo *in_stack_fffffffffffffc10;
  Scope *in_stack_fffffffffffffc18;
  Compilation *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  iterator local_3b0;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  local_388;
  ResolvedConfig *local_330;
  SourceRange local_328;
  size_t local_318;
  char *pcStack_310;
  long local_2f8;
  undefined8 local_2e0;
  Compilation *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined1 *local_2c0;
  DefinitionSymbol **local_2b8;
  undefined1 *local_2b0;
  ResolvedConfig **local_2a8;
  underlying_type local_299;
  undefined1 local_288 [112];
  Scope *in_stack_fffffffffffffde8;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffdf4;
  string_view in_stack_fffffffffffffdf8;
  HierarchicalInstanceSyntax *in_stack_fffffffffffffe20;
  DefinitionLookupResult *in_stack_fffffffffffffe28;
  anon_class_72_9_2532bcb6 *in_stack_fffffffffffffe30;
  SourceRange in_stack_fffffffffffffe40;
  bitmask<slang::ast::InstanceFlags> local_111;
  SourceRange local_110;
  undefined4 local_100;
  bitmask<slang::ast::InstanceFlags> local_fa;
  bitmask<slang::ast::InstanceFlags> local_f9;
  ResolvedConfig *local_f8;
  SourceLocation local_f0;
  DefinitionSymbol *local_e8;
  underlying_type local_dd;
  bitmask<slang::ast::LookupFlags> local_dc;
  size_t local_d8;
  char *pcStack_d0;
  Symbol *local_c8;
  bitmask<slang::ast::InstanceFlags> local_b9;
  int local_b8;
  bitmask<slang::ast::InstanceFlags> local_b4;
  bitmask<slang::ast::InstanceFlags> local_b3;
  underlying_type local_b2;
  bitmask<slang::ast::InstanceFlags> local_b1;
  CheckerInstanceBodySymbol *local_b0;
  underlying_type local_a2;
  bitmask<slang::ast::InstanceFlags> local_a1;
  Symbol *local_a0;
  Scope *local_88;
  InstanceBodySymbol *local_80;
  undefined1 local_72;
  bitmask<slang::ast::InstanceFlags> local_71;
  anon_class_8_1_df651b10 local_70;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string_view local_40;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  Compilation *local_18;
  undefined8 local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = parsing::Token::valueText((Token *)in_stack_fffffffffffffb00);
  local_58 = sv((char *)in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
  local_70.defName = &local_40;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_InstanceSymbols_cpp:520:51)>
            (&local_68,&local_70);
  name._M_str._0_4_ = in_stack_fffffffffffffb20;
  name._M_len = (size_t)in_stack_fffffffffffffb18;
  name._M_str._4_4_ = in_stack_fffffffffffffb24;
  detail.callable = (intptr_t)in_stack_fffffffffffffb10;
  detail.callback =
       (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_intptr_t *)
       in_stack_fffffffffffffb08;
  TimeTraceScope::TimeTraceScope((TimeTraceScope *)in_stack_fffffffffffffb00,name,detail);
  bitmask<slang::ast::InstanceFlags>::bitmask(&local_71);
  local_72 = 0;
  local_80 = (InstanceBodySymbol *)0x0;
  local_88 = not_null::operator_cast_to_Scope_((not_null<const_slang::ast::Scope_*> *)0x8d2661);
  do {
    local_a0 = Scope::asSymbol(local_88);
    if (local_a0->kind == InstanceBody) {
      local_80 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x8d26c0);
      local_a2 = (underlying_type)ast::operator~(None);
      local_a1 = bitmask<slang::ast::InstanceFlags>::operator&
                           ((bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffaf8,
                            in_stack_fffffffffffffaf0);
      bitmask<slang::ast::InstanceFlags>::operator|=(&local_71,&local_a1);
      break;
    }
    if (local_a0->kind == CheckerInstanceBody) {
      local_b0 = Symbol::as<slang::ast::CheckerInstanceBodySymbol>((Symbol *)0x8d276e);
      local_72 = 1;
      in_stack_fffffffffffffbb8 = (Scope *)&local_b0->flags;
      local_b2 = (underlying_type)ast::operator~(None);
      local_b1 = bitmask<slang::ast::InstanceFlags>::operator&
                           ((bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffaf8,
                            in_stack_fffffffffffffaf0);
      bitmask<slang::ast::InstanceFlags>::operator|=(&local_71,&local_b1);
      local_88 = Symbol::getParentScope((Symbol *)local_b0->parentInstance);
    }
    else {
      if ((local_a0->kind == GenerateBlock) &&
         (pGVar2 = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x8d2832),
         (pGVar2->isUninstantiated & 1U) != 0)) {
        bitmask<slang::ast::InstanceFlags>::bitmask(&local_b3,Uninstantiated);
        bitmask<slang::ast::InstanceFlags>::operator|=(&local_71,&local_b3);
      }
      local_88 = Symbol::getParentScope(local_a0);
    }
  } while (local_88 != (Scope *)0x0);
  bitmask<slang::ast::InstanceFlags>::bitmask(&local_b4,Uninstantiated);
  bVar1 = bitmask<slang::ast::InstanceFlags>::has
                    (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (bVar1) {
    UninstantiatedDefSymbol::fromSyntax
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_b8 = 1;
    goto LAB_008d3181;
  }
  if (local_30 != 0) {
    bitmask<slang::ast::InstanceFlags>::bitmask(&local_b9,FromBind);
    bitmask<slang::ast::InstanceFlags>::operator|=(&local_71,&local_b9);
  }
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x8d2954);
  local_d8 = local_40._M_len;
  pcStack_d0 = local_40._M_str;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_dc,AllowDeclaredAfter);
  local_c8 = Lookup::unqualified(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf8,
                                 in_stack_fffffffffffffdf4);
  if ((local_c8 != (Symbol *)0x0) && (local_c8->kind == Checker)) {
    Symbol::as<slang::ast::CheckerSymbol>((Symbol *)0x8d29e3);
    local_dd = local_71.m_bits;
    CheckerInstanceSymbol::fromSyntax
              ((CheckerSymbol *)in_stack_fffffffffffffb18,
               (HierarchyInstantiationSyntax *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               in_stack_fffffffffffffb00,
               (SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffaf8,
               (bitmask<slang::ast::InstanceFlags>)in_stack_fffffffffffffb24.code._1_1_);
    local_b8 = 1;
    goto LAB_008d3181;
  }
  local_e8 = (DefinitionSymbol *)0x0;
  local_f0 = (SourceLocation)0x0;
  local_f8 = (ResolvedConfig *)0x0;
  if (local_80 != (InstanceBodySymbol *)0x0) {
    local_e8 = InstanceBodySymbol::getDefinition(local_80);
    if (local_80->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) {
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x8d2abe);
      in_stack_fffffffffffffb78 =
           (SourceLocation)
           anon_unknown.dwarf_127610f::findParentOverrideNode(in_stack_fffffffffffffbb8);
      local_f0 = in_stack_fffffffffffffb78;
    }
    if (local_80->parentInstance != (InstanceSymbol *)0x0) {
      local_f8 = local_80->parentInstance->resolvedConfig;
    }
    bitmask<slang::ast::InstanceFlags>::bitmask(&local_f9,FromBind);
    bVar1 = bitmask<slang::ast::InstanceFlags>::has
                      (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    if (bVar1) {
      bitmask<slang::ast::InstanceFlags>::bitmask(&local_fa,ParentFromBind);
      bVar1 = bitmask<slang::ast::InstanceFlags>::has
                        (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      if (bVar1) {
        local_100 = 0xb0006;
        local_110 = parsing::Token::range((Token *)in_stack_fffffffffffffb10);
        sourceRange.endLoc = in_stack_fffffffffffffb18;
        sourceRange.startLoc = in_stack_fffffffffffffb10;
        ASTContext::addDiag(in_stack_fffffffffffffb08,in_stack_fffffffffffffb24,sourceRange);
        local_b8 = 1;
        goto LAB_008d3181;
      }
      bitmask<slang::ast::InstanceFlags>::bitmask(&local_111,ParentFromBind);
      bitmask<slang::ast::InstanceFlags>::operator|=(&local_71,&local_111);
    }
  }
  this_00 = local_18;
  uVar7 = local_28;
  SVar8 = local_f0;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffb00,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffaf8);
  local_299 = local_71.m_bits;
  attributes._M_extent._M_extent_value = in_stack_fffffffffffffb60._M_extent_value;
  attributes._M_ptr = (pointer)SVar8;
  SVar6 = in_stack_00000008;
  anon_unknown.dwarf_127610f::InstanceBuilder::InstanceBuilder
            ((InstanceBuilder *)this_00,(ASTContext *)in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,attributes,
             (bitmask<slang::ast::InstanceFlags>)(underlying_type)((ulong)uVar7 >> 0x38),
             (SyntaxNode *)in_stack_fffffffffffffb78);
  code = SUB84((ulong)uVar7 >> 0x20,0);
  local_2e0 = local_10;
  local_2d8 = local_18;
  local_2d0 = local_20;
  local_2c8 = local_28;
  local_2c0 = local_288;
  local_2b8 = &local_e8;
  local_2b0 = &local_72;
  local_2a8 = &local_f8;
  if (local_30 == 0) {
    if (local_f8 != (ResolvedConfig *)0x0) {
      SVar5 = (SourceLocation)&local_388;
      SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
      ::SmallVector((SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
                     *)0x8d2f05);
      anon_unknown.dwarf_127610f::
      resolveInstanceOverrides<slang::syntax::HierarchyInstantiationSyntax>
                ((ResolvedConfig *)in_stack_00000008,unaff_retaddr,in_RDI,
                 (string_view)in_stack_00000018,in_stack_00000014,
                 (ResolvedInstanceRules *)builder.implicitNetNames._160_8_);
      bVar1 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
              ::empty(&local_388);
      code = SUB84((ulong)uVar7 >> 0x20,0);
      if (bVar1) {
        local_b8 = 0;
      }
      else {
        local_3b0 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                    ::begin(&local_388);
        ppVar3 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                 ::end(&local_388);
        for (; code = SUB84((ulong)uVar7 >> 0x20,0), local_3b0 != ppVar3; local_3b0 = local_3b0 + 1)
        {
          std::
          get<0ul,slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>
                    ((pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                      *)0x8d2fe4);
          std::
          get<1ul,slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>
                    ((pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                      *)0x8d2ff9);
          fromSyntax::anon_class_72_9_2532bcb6::operator()
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        }
        local_b8 = 1;
      }
      SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
      ::~SmallVector((SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
                      *)0x8d3089);
      SVar4.endLoc = SVar6;
      SVar4.startLoc = SVar5;
      if (local_b8 != 0) goto LAB_008d3174;
    }
    this = not_null<const_slang::ast::Scope_*>::operator*
                     ((not_null<const_slang::ast::Scope_*> *)0x8d30c6);
    SVar4 = parsing::Token::range((Token *)this);
    name_00._M_str = (char *)in_stack_fffffffffffffb60._M_extent_value;
    name_00._M_len = (size_t)SVar8;
    sourceRange_00.endLoc = in_stack_fffffffffffffb78;
    sourceRange_00.startLoc = in_stack_fffffffffffffb70;
    Compilation::getDefinition(this_00,name_00,in_stack_fffffffffffffb40,sourceRange_00,code);
    fromSyntax::anon_class_72_9_2532bcb6::operator()
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_b8 = 0;
  }
  else {
    local_318 = local_40._M_len;
    pcStack_310 = local_40._M_str;
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x8d2d8b);
    SVar4 = parsing::Token::range((Token *)in_stack_fffffffffffffb10);
    name_01._M_str = in_stack_fffffffffffffc30;
    name_01._M_len = in_stack_fffffffffffffc28;
    local_328 = SVar4;
    Compilation::getDefinition
              (in_stack_fffffffffffffc20,name_01,in_stack_fffffffffffffc18,in_stack_fffffffffffffe40
               ,in_stack_fffffffffffffc10);
    if (local_2f8 != 0) {
      local_330 = BumpAllocator::
                  emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol_const&>
                            ((BumpAllocator *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                             (InstanceSymbol *)SVar4.endLoc);
      local_f8 = local_330;
      if ((*(byte *)(local_30 + 0x30) & 1) == 0) {
        local_2f8 = 0;
        (local_330->liblist)._M_ptr = *(pointer *)(local_30 + 0x20);
        (local_330->liblist)._M_extent._M_extent_value = *(size_t *)(local_30 + 0x28);
      }
    }
    fromSyntax::anon_class_72_9_2532bcb6::operator()
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_b8 = 1;
  }
LAB_008d3174:
  anon_unknown.dwarf_127610f::InstanceBuilder::~InstanceBuilder((InstanceBuilder *)SVar4.endLoc);
LAB_008d3181:
  TimeTraceScope::~TimeTraceScope((TimeTraceScope *)0x8d318e);
  return;
}

Assistant:

void InstanceSymbol::fromSyntax(Compilation& comp, const HierarchyInstantiationSyntax& syntax,
                                const ASTContext& context, SmallVectorBase<const Symbol*>& results,
                                SmallVectorBase<const Symbol*>& implicitNets,
                                const BindDirectiveInfo* bindInfo,
                                const SyntaxNode* overrideSyntax) {
    auto defName = syntax.type.valueText();
    TimeTraceScope timeScope("createInstances"sv, [&] { return std::string(defName); });

    // Find our parent instance, if there is one.
    bitmask<InstanceFlags> flags;
    bool inChecker = false;
    const InstanceBodySymbol* parentInst = nullptr;
    const Scope* currScope = context.scope;
    do {
        auto& sym = currScope->asSymbol();
        if (sym.kind == SymbolKind::InstanceBody) {
            parentInst = &sym.as<InstanceBodySymbol>();
            flags |= parentInst->flags & ~InstanceFlags::FromBind;
            break;
        }

        if (sym.kind == SymbolKind::CheckerInstanceBody) {
            auto& body = sym.as<CheckerInstanceBodySymbol>();
            inChecker = true;
            flags |= body.flags & ~InstanceFlags::FromBind;
            currScope = body.parentInstance->getParentScope();
            continue;
        }

        if (sym.kind == SymbolKind::GenerateBlock) {
            if (sym.as<GenerateBlockSymbol>().isUninstantiated)
                flags |= InstanceFlags::Uninstantiated;
        }
        currScope = sym.getParentScope();
    } while (currScope);

    // If this instance is not instantiated then we'll just fill in a placeholder
    // and move on. This is likely inside an untaken generate branch.
    if (flags.has(InstanceFlags::Uninstantiated)) {
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, context, results, implicitNets);
        return;
    }

    if (bindInfo)
        flags |= InstanceFlags::FromBind;

    // Unfortunately this instantiation could be for a checker instead of a
    // module/interface/program, so we're forced to do a real name lookup here
    // in the local scope before doing a global definition lookup.
    if (auto sym = Lookup::unqualified(*context.scope, defName, LookupFlags::AllowDeclaredAfter)) {
        if (sym->kind == SymbolKind::Checker) {
            CheckerInstanceSymbol::fromSyntax(sym->as<CheckerSymbol>(), syntax, context, results,
                                              implicitNets, flags);
            return;
        }
    }

    const DefinitionSymbol* owningDefinition = nullptr;
    const HierarchyOverrideNode* parentOverrideNode = nullptr;
    const ResolvedConfig* resolvedConfig = nullptr;
    if (parentInst) {
        owningDefinition = &parentInst->getDefinition();

        // In the uncommon case that our parent instance has an override
        // node set, we need to go back and make sure we account for any
        // generate blocks that might actually be along the parent path for
        // the new instances we're creating.
        if (parentInst->hierarchyOverrideNode)
            parentOverrideNode = findParentOverrideNode(*context.scope);

        // Check if our parent has a configuration applied. If so, and if
        // that configuration has instance overrides, we need to check if
        // any of them apply to the instances we're about to create.
        if (parentInst->parentInstance)
            resolvedConfig = parentInst->parentInstance->resolvedConfig;

        if (flags.has(InstanceFlags::FromBind)) {
            if (flags.has(InstanceFlags::ParentFromBind)) {
                context.addDiag(diag::BindUnderBind, syntax.type.range());
                return;
            }

            // If our parent is from a bind statement, pass down the flag
            // so that we prevent further binds below us too.
            flags |= InstanceFlags::ParentFromBind;
        }
    }

    InstanceBuilder builder(context, implicitNets, parentOverrideNode, syntax.attributes, flags,
                            overrideSyntax);

    // Creates instance symbols -- if specificInstance is provided then only that
    // instance will be created, otherwise all instances in the original syntax
    // node will be created in one go.
    auto createInstances = [&](const Compilation::DefinitionLookupResult& defResult,
                               const HierarchicalInstanceSyntax* specificInstance) {
        auto def = defResult.definition;
        if (!def) {
            UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                                implicitNets, builder.implicitNetNames,
                                                builder.netType);
            return;
        }

        auto confRule = defResult.configRule;
        auto addDiag = [&](DiagCode code) -> Diagnostic& {
            if (confRule) {
                SLANG_ASSERT(specificInstance);
                auto& diag = context.addDiag(code, specificInstance->sourceRange());
                diag.addNote(diag::NoteConfigRule, confRule->syntax->sourceRange());
                return diag;
            }
            else {
                auto& diag = context.addDiag(code, syntax.type.range());
                if (specificInstance)
                    diag << specificInstance->sourceRange();
                return diag;
            }
        };

        if (def->kind == SymbolKind::Primitive) {
            PrimitiveInstanceSymbol::fromSyntax(def->as<PrimitiveSymbol>(), syntax,
                                                specificInstance, context, results, implicitNets,
                                                builder.implicitNetNames);
            if (!results.empty()) {
                if (!owningDefinition ||
                    owningDefinition->definitionKind != DefinitionKind::Module || inChecker) {
                    addDiag(diag::InvalidPrimInstanceForParent);
                }
                else if (confRule && confRule->paramOverrides) {
                    addDiag(diag::ConfigParamsForPrimitive);
                }
            }
            return;
        }

        auto& definition = def->as<DefinitionSymbol>();
        definition.noteInstantiated();

        if (inChecker) {
            addDiag(diag::InvalidInstanceForParent)
                << definition.getArticleKindString() << "a checker"sv;
        }
        else if (owningDefinition) {
            auto owningKind = owningDefinition->definitionKind;
            if (owningKind == DefinitionKind::Program ||
                (owningKind == DefinitionKind::Interface &&
                 definition.definitionKind == DefinitionKind::Module)) {
                addDiag(diag::InvalidInstanceForParent) << definition.getArticleKindString()
                                                        << owningDefinition->getArticleKindString();
            }
        }

        ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
        if (syntax.parameters)
            paramBuilder.setAssignments(*syntax.parameters, /* isFromConfig */ false);

        auto localConfig = resolvedConfig;
        if (confRule) {
            SLANG_ASSERT(resolvedConfig);
            auto rc = comp.emplace<ResolvedConfig>(*resolvedConfig);
            rc->configRule = confRule;

            confRule->isUsed = true;
            if (confRule->liblist)
                rc->liblist = *confRule->liblist;
            localConfig = rc;

            if (confRule->paramOverrides) {
                paramBuilder.setConfigScope(rc->useConfig);
                paramBuilder.setAssignments(*confRule->paramOverrides, /* isFromConfig */ true);
            }
        }

        builder.reset(definition, paramBuilder, localConfig, defResult.configRoot);

        if (specificInstance) {
            results.push_back(builder.create(*specificInstance));
        }
        else {
            // NOLINTNEXTLINE
            for (auto instanceSyntax : syntax.instances)
                results.push_back(builder.create(*instanceSyntax));
        }
    };

    // If we came here from a bind directive we need to make use
    // of the definition / config info that has already been resolved.
    if (bindInfo) {
        auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                            *bindInfo);
        if (defResult.configRoot) {
            SLANG_ASSERT(parentInst && parentInst->parentInstance);
            auto rc = comp.emplace<ResolvedConfig>(*defResult.configRoot,
                                                   *parentInst->parentInstance);
            resolvedConfig = rc;

            if (!bindInfo->isNewConfigRoot) {
                // This is not a new config root, so normally we'd use our parent's
                // config. For binds though we don't know the right parent scope
                // because it's the scope that contains the bind directive, not the
                // one that contains the instance, so recreate it here.
                defResult.configRoot = nullptr;
                rc->liblist = bindInfo->liblist;
            }
        }

        createInstances(defResult, nullptr);
        return;
    }

    if (resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*resolvedConfig, context, syntax, defName, diag::UnknownModule,
                                 instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createInstances(defResult, instSyntax);
            return;
        }
    }

    // Simple case: look up the definition and create all instances in one go.
    auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                        diag::UnknownModule);
    createInstances(defResult, nullptr);
}